

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::DrawTiltedSpanPalCommand::Execute(DrawTiltedSpanPalCommand *this,DrawerThread *thread)

{
  float fVar1;
  uint8_t *puVar2;
  bool bVar3;
  byte bVar4;
  float fVar5;
  byte bVar6;
  undefined1 auVar7 [16];
  byte bVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  float fVar23;
  double dVar24;
  double dVar25;
  float fVar26;
  float fVar27;
  double dVar28;
  undefined1 auVar29 [16];
  double dVar30;
  
  auVar7 = _DAT_005d6240;
  iVar11 = *(int *)&(this->super_DrawerCommand).field_0xc;
  if (((thread->pass_start_y <= iVar11) && (iVar11 < thread->pass_end_y)) &&
     (iVar11 % thread->num_cores == thread->core)) {
    iVar15 = this->x1;
    fVar23 = (float)(centery - iVar11);
    fVar27 = (float)(iVar15 - centerx);
    uVar17 = this->x2 - iVar15;
    fVar26 = (this->plane_sz).X;
    dVar30 = (double)(fVar26 * fVar27 + (this->plane_sz).Y * fVar23 + (this->plane_sz).Z);
    if (this->plane_shade == false) {
      if (0 < (int)uVar17) {
        puVar2 = this->_colormap;
        lVar13 = (ulong)uVar17 - 1;
        auVar19._8_4_ = (int)lVar13;
        auVar19._0_8_ = lVar13;
        auVar19._12_4_ = (int)((ulong)lVar13 >> 0x20);
        uVar12 = 0;
        auVar19 = auVar19 ^ _DAT_005d6240;
        auVar22 = _DAT_005d6230;
        do {
          auVar29 = auVar22 ^ auVar7;
          if ((bool)(~(auVar29._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar29._0_4_ ||
                      auVar19._4_4_ < auVar29._4_4_) & 1)) {
            thread->tiltlighting[uVar12] = puVar2;
          }
          if ((auVar29._12_4_ != auVar19._12_4_ || auVar29._8_4_ <= auVar19._8_4_) &&
              auVar29._12_4_ <= auVar19._12_4_) {
            thread->tiltlighting[uVar12 + 1] = puVar2;
          }
          uVar12 = uVar12 + 2;
          lVar13 = auVar22._8_8_;
          auVar22._0_8_ = auVar22._0_8_ + 2;
          auVar22._8_8_ = lVar13 + 2;
        } while ((uVar17 + 1 & 0xfffffffe) != uVar12);
      }
    }
    else {
      CalcTiltedLighting(this,(double)this->planelightfloat * dVar30,
                         ((double)(fVar26 * (float)(int)uVar17) + dVar30) *
                         (double)this->planelightfloat,uVar17,thread);
      iVar11 = *(int *)&(this->super_DrawerCommand).field_0xc;
      fVar23 = (float)(centery - iVar11);
      iVar15 = this->x1;
      fVar26 = (this->plane_sz).X;
      fVar27 = (float)(iVar15 - centerx);
    }
    fVar5 = (this->plane_sv).X;
    lVar13 = (long)iVar15 + (long)(int)(&ylookup)[iVar11];
    puVar2 = this->_destorg;
    bVar6 = (byte)this->_ybits;
    bVar4 = 0x20 - bVar6;
    bVar8 = (byte)this->_xbits;
    bVar9 = bVar4 - bVar8;
    uVar14 = ~(-1 << (bVar8 & 0x1f)) << (bVar6 & 0x1f);
    fVar1 = (this->plane_su).X;
    dVar24 = (double)(fVar27 * fVar5 + (this->plane_sv).Z + fVar23 * (this->plane_sv).Y);
    dVar25 = (double)(fVar27 * fVar1 + (this->plane_su).Z + fVar23 * (this->plane_su).Y);
    dVar18 = (1.0 / dVar30) * dVar24;
    dVar20 = (1.0 / dVar30) * dVar25;
    this->x1 = 0;
    iVar11 = uVar17 + 1;
    if ((int)uVar17 < 0xf) {
      iVar15 = 0;
    }
    else {
      iVar15 = 0;
      dVar28 = dVar18;
      dVar21 = dVar20;
      iVar10 = iVar11;
      do {
        dVar24 = dVar24 + (double)(fVar5 * 16.0);
        dVar25 = dVar25 + (double)(fVar1 * 16.0);
        dVar30 = dVar30 + (double)(fVar26 * 16.0);
        dVar18 = (1.0 / dVar30) * dVar24;
        dVar20 = (1.0 / dVar30) * dVar25;
        uVar17 = (int)(long)dVar21 + this->pviewx;
        uVar16 = (int)(long)dVar28 + this->pviewy;
        iVar11 = -0x10;
        do {
          puVar2[iVar15 + lVar13] =
               thread->tiltlighting[iVar15]
               [this->_source[uVar17 >> (bVar9 & 0x1f) & uVar14 | uVar16 >> (bVar4 & 0x1f)]];
          iVar15 = this->x1 + 1;
          this->x1 = iVar15;
          uVar17 = uVar17 + (int)(long)((dVar20 - dVar21) * 0.0625);
          uVar16 = uVar16 + (int)(long)((dVar18 - dVar28) * 0.0625);
          iVar11 = iVar11 + 1;
        } while (iVar11 != 0);
        iVar11 = iVar10 + -0x10;
        bVar3 = 0x1f < iVar10;
        dVar28 = dVar18;
        dVar21 = dVar20;
        iVar10 = iVar11;
      } while (bVar3);
    }
    if (0 < iVar11) {
      if (iVar11 == 1) {
        puVar2[iVar15 + lVar13] =
             thread->tiltlighting[iVar15]
             [this->_source
              [(uint)(long)dVar20 >> (bVar9 & 0x1f) & uVar14 | (uint)(long)dVar18 >> (bVar4 & 0x1f)]
             ];
      }
      else {
        dVar28 = (double)iVar11;
        fVar26 = (this->plane_su).X;
        fVar23 = (this->plane_sv).X;
        dVar30 = 1.0 / ((double)(this->plane_sz).X * dVar28 + dVar30);
        uVar16 = (int)(long)dVar20 + this->pviewx;
        uVar17 = (int)(long)dVar18 + this->pviewy;
        do {
          puVar2[iVar15 + lVar13] =
               thread->tiltlighting[iVar15]
               [this->_source[uVar16 >> (bVar9 & 0x1f) & uVar14 | uVar17 >> (bVar4 & 0x1f)]];
          iVar15 = this->x1 + 1;
          this->x1 = iVar15;
          uVar16 = uVar16 + (int)(long)(((dVar25 + (double)fVar26 * dVar28) * dVar30 - dVar20) *
                                       (1.0 / dVar28));
          uVar17 = uVar17 + (int)(long)((dVar30 * ((double)fVar23 * dVar28 + dVar24) - dVar18) *
                                       (1.0 / dVar28));
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
    }
  }
  return;
}

Assistant:

void DrawTiltedSpanPalCommand::Execute(DrawerThread *thread)
	{
		if (thread->line_skipped_by_thread(y))
			return;

		const uint8_t **tiltlighting = thread->tiltlighting;

		int width = x2 - x1;
		double iz, uz, vz;
		uint8_t *fb;
		uint32_t u, v;
		int i;

		iz = plane_sz[2] + plane_sz[1] * (centery - y) + plane_sz[0] * (x1 - centerx);

		// Lighting is simple. It's just linear interpolation from start to end
		if (plane_shade)
		{
			uz = (iz + plane_sz[0] * width) * planelightfloat;
			vz = iz * planelightfloat;
			CalcTiltedLighting(vz, uz, width, thread);
		}
		else
		{
			for (int i = 0; i < width; ++i)
			{
				tiltlighting[i] = _colormap;
			}
		}

		uz = plane_su[2] + plane_su[1] * (centery - y) + plane_su[0] * (x1 - centerx);
		vz = plane_sv[2] + plane_sv[1] * (centery - y) + plane_sv[0] * (x1 - centerx);

		fb = ylookup[y] + x1 + _destorg;

		uint8_t vshift = 32 - _ybits;
		uint8_t ushift = vshift - _xbits;
		int umask = ((1 << _xbits) - 1) << _ybits;

		#if 0
		// The "perfect" reference version of this routine. Pretty slow.
		// Use it only to see how things are supposed to look.
		i = 0;
		do
		{
			double z = 1.f / iz;

			u = int64_t(uz*z) + pviewx;
			v = int64_t(vz*z) + pviewy;
			R_SetDSColorMapLight(tiltlighting[i], 0, 0);
			fb[i++] = ds_colormap[ds_source[(v >> vshift) | ((u >> ushift) & umask)]];
			iz += plane_sz[0];
			uz += plane_su[0];
			vz += plane_sv[0];
		} while (--width >= 0);
		#else
		//#define SPANSIZE 32
		//#define INVSPAN 0.03125f
		//#define SPANSIZE 8
		//#define INVSPAN 0.125f
		#define SPANSIZE 16
		#define INVSPAN	0.0625f

		double startz = 1.f / iz;
		double startu = uz*startz;
		double startv = vz*startz;
		double izstep, uzstep, vzstep;

		izstep = plane_sz[0] * SPANSIZE;
		uzstep = plane_su[0] * SPANSIZE;
		vzstep = plane_sv[0] * SPANSIZE;
		x1 = 0;
		width++;

		while (width >= SPANSIZE)
		{
			iz += izstep;
			uz += uzstep;
			vz += vzstep;

			double endz = 1.f / iz;
			double endu = uz*endz;
			double endv = vz*endz;
			uint32_t stepu = (uint32_t)int64_t((endu - startu) * INVSPAN);
			uint32_t stepv = (uint32_t)int64_t((endv - startv) * INVSPAN);
			u = (uint32_t)(int64_t(startu) + pviewx);
			v = (uint32_t)(int64_t(startv) + pviewy);

			for (i = SPANSIZE - 1; i >= 0; i--)
			{
				fb[x1] = *(tiltlighting[x1] + _source[(v >> vshift) | ((u >> ushift) & umask)]);
				x1++;
				u += stepu;
				v += stepv;
			}
			startu = endu;
			startv = endv;
			width -= SPANSIZE;
		}
		if (width > 0)
		{
			if (width == 1)
			{
				u = (uint32_t)int64_t(startu);
				v = (uint32_t)int64_t(startv);
				fb[x1] = *(tiltlighting[x1] + _source[(v >> vshift) | ((u >> ushift) & umask)]);
			}
			else
			{
				double left = width;
				iz += plane_sz[0] * left;
				uz += plane_su[0] * left;
				vz += plane_sv[0] * left;

				double endz = 1.f / iz;
				double endu = uz*endz;
				double endv = vz*endz;
				left = 1.f / left;
				uint32_t stepu = (uint32_t)int64_t((endu - startu) * left);
				uint32_t stepv = (uint32_t)int64_t((endv - startv) * left);
				u = (uint32_t)(int64_t(startu) + pviewx);
				v = (uint32_t)(int64_t(startv) + pviewy);

				for (; width != 0; width--)
				{
					fb[x1] = *(tiltlighting[x1] + _source[(v >> vshift) | ((u >> ushift) & umask)]);
					x1++;
					u += stepu;
					v += stepv;
				}
			}
		}
		#endif
	}